

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,testing::NiceMock<MockNLHandler>>
::
ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,testing::NiceMock<MockNLHandler>>::ObjHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,testing::NiceMock<MockNLHandler>>
           *this)

{
  Result_conflict RVar1;
  int gmock_a1;
  int gmock_a2;
  
  gmock_a1 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
             ::ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
                         *)this,*(uint *)(*(long *)(this + 8) + 8));
  gmock_a2 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
             ::ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
                         *)this,1,**(int **)(this + 8) + 1);
  RVar1 = MockNLHandler::NeedObj(*(MockNLHandler **)(this + 0x10),gmock_a1);
  if (RVar1) {
    MockNLHandler::OnLinearObjExpr(*(MockNLHandler **)(this + 0x10),gmock_a1,gmock_a2);
    ReadLinearExpr<mp::NLHandler<MockNLHandler,BasicTestExpr<0>>::LinearExprHandler>(this,gmock_a2);
    return;
  }
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
  ::ReadLinearExpr<mp::internal::NullLinearExprHandler>
            ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
              *)this,gmock_a2);
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr() {
  LinearHandler lh(*this);
  int index = ReadUInt(lh.num_items());
  // The number of terms should be less than num_vars because common
  // expressions are not allowed in a linear expression.
  int num_terms = ReadUInt(1, header_.num_vars + 1u);
  reader_.ReadTillEndOfLine();
  if (lh.SkipExpr(index))
    ReadLinearExpr(num_terms, NullLinearExprHandler());
  else
    ReadLinearExpr(num_terms, lh.OnLinearExpr(index, num_terms));
}